

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-utf8.h
# Opt level: O0

int fy_utf8_get(void *ptr,int left,int *widthp)

{
  uint8_t *p;
  int *widthp_local;
  int left_local;
  void *ptr_local;
  
  if (left < 1) {
    *widthp = 0;
    ptr_local._4_4_ = 0xffffffff;
  }
  else if ((*ptr & 0x80) == 0) {
    *widthp = 1;
    ptr_local._4_4_ = *ptr & 0x7f;
  }
  else {
    ptr_local._4_4_ = fy_utf8_get_generic(ptr,left,widthp);
  }
  return ptr_local._4_4_;
}

Assistant:

static inline int fy_utf8_get(const void *ptr, int left, int *widthp) {
    const uint8_t *p = ptr;

    /* single byte (hot path) */
    if (left <= 0) {
        *widthp = 0;
        return FYUG_EOF;
    }

    if (!(p[0] & 0x80)) {
        *widthp = 1;
        return p[0] & 0x7f;
    }
    return fy_utf8_get_generic(ptr, left, widthp);
}